

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnectionChannel::closeAndResendCurrentRequest(QHttpNetworkConnectionChannel *this)

{
  QHttpNetworkConnection *pQVar1;
  int in_ESI;
  QObject *pQVar2;
  
  requeueCurrentlyPipelinedRequests(this);
  close(this,in_ESI);
  if (*(long *)(this + 0x38) != 0) {
    this[0x50] = (QHttpNetworkConnectionChannel)0x1;
  }
  if ((*(long *)(this + 0xf0) == 0) || (*(int *)(*(long *)(this + 0xf0) + 4) == 0)) {
    pQVar2 = (QObject *)0x0;
  }
  else {
    pQVar2 = *(QObject **)(this + 0xf8);
  }
  pQVar1 = QtPrivate::qobject_cast_helper<QHttpNetworkConnection*,QObject>(pQVar2);
  if (pQVar1 != (QHttpNetworkConnection *)0x0) {
    if ((*(long *)(this + 0xf0) == 0) || (*(int *)(*(long *)(this + 0xf0) + 4) == 0)) {
      pQVar2 = (QObject *)0x0;
    }
    else {
      pQVar2 = *(QObject **)(this + 0xf8);
    }
    QMetaObject::invokeMethod<>(pQVar2,"_q_startNextRequest",QueuedConnection);
    return;
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::closeAndResendCurrentRequest()
{
    requeueCurrentlyPipelinedRequests();
    close();
    if (reply)
        resendCurrent = true;
    if (qobject_cast<QHttpNetworkConnection*>(connection))
        QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
}